

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

string * __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CurrentValue_abi_cxx11_
          (string *__return_storage_ptr__,FlagImpl *this)

{
  FlagOpFn p_Var1;
  ptr_t pvVar2;
  uint uVar3;
  atomic<long> *paVar4;
  void *dst;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar5;
  array<char,_8UL> one_word_val;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> local_38;
  
  DataGuard(this);
  uVar3 = *(uint *)&this->field_0x28 >> 1 & 3;
  if (uVar3 < 2) {
    paVar4 = OneWordValue(this);
    local_38._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.
    op = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         (paVar4->super___atomic_base<long>)._M_i;
    p_Var1 = this->op_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    (*p_Var1)(kUnparse,&local_38,__return_storage_ptr__,(void *)0x0);
  }
  else if (uVar3 == 2) {
    dst = (*this->op_)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    DynValueDeleter::DynValueDeleter((DynValueDeleter *)&local_38,this->op_);
    local_38._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = dst;
    ReadSequenceLockedData(this,dst);
    p_Var1 = this->op_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    (*p_Var1)(kUnparse,dst,__return_storage_ptr__,(void *)0x0);
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
              (&local_38);
  }
  else {
    absl::lts_20240722::Mutex::Lock();
    p_Var1 = this->op_;
    paVar5 = PtrStorage(this);
    pvVar2 = (paVar5->_M_i).ptr_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    (*p_Var1)(kUnparse,(void *)((ulong)pvVar2 & 0xfffffffffffffffc),__return_storage_ptr__,
              (void *)0x0);
    absl::lts_20240722::Mutex::Unlock();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FlagImpl::CurrentValue() const {
  auto* guard = DataGuard();  // Make sure flag initialized
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      const auto one_word_val =
          absl::bit_cast<std::array<char, sizeof(int64_t)>>(
              OneWordValue().load(std::memory_order_acquire));
      return flags_internal::Unparse(op_, one_word_val.data());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      std::unique_ptr<void, DynValueDeleter> cloned(flags_internal::Alloc(op_),
                                                    DynValueDeleter{op_});
      ReadSequenceLockedData(cloned.get());
      return flags_internal::Unparse(op_, cloned.get());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      absl::MutexLock l(guard);
      return flags_internal::Unparse(
          op_, PtrStorage().load(std::memory_order_acquire).Ptr());
    }
  }

  return "";
}